

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateSimpleRecurrentLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  pointer pcVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  void *pvVar9;
  uint uVar10;
  LayerUnion LVar11;
  bool bVar12;
  char cVar13;
  bool bVar14;
  long *plVar15;
  char cVar16;
  size_type *psVar17;
  undefined1 *puVar18;
  Result *_result;
  char cVar19;
  uint uVar20;
  undefined1 *puVar21;
  string err;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  LayerUnion local_58;
  string local_50;
  
  validateInputCount(__return_storage_ptr__,layer,2,2);
  bVar12 = Result::good(__return_storage_ptr__);
  if (bVar12) {
    pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    validateOutputCount(__return_storage_ptr__,layer,2,2);
    bVar12 = Result::good(__return_storage_ptr__);
    if (bVar12) {
      pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 != paVar1) {
        operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
      }
      if (this->ndArrayInterpretation == true) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"SimpleRecurrent","");
        validateInputOutputRankEquality
                  (__return_storage_ptr__,layer,&local_50,&this->blobNameToRank);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        bVar12 = Result::good(__return_storage_ptr__);
        if (!bVar12) {
          return __return_storage_ptr__;
        }
        pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 != paVar1) {
          operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
        }
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"SimpleRecurrent","");
        validateRankCount(__return_storage_ptr__,layer,&local_a0,5,5,&this->blobNameToRank);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        bVar12 = Result::good(__return_storage_ptr__);
        if (!bVar12) {
          return __return_storage_ptr__;
        }
        pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 != paVar1) {
          operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
        }
      }
      if (layer->_oneof_case_[0] == 400) {
        local_58 = layer->layer_;
      }
      else {
        local_58.convolution_ =
             (ConvolutionLayerParams *)Specification::_SimpleRecurrentLayerParams_default_instance_;
      }
      puVar21 = (undefined1 *)(local_58.innerproduct_)->bias_;
      if ((WeightParams *)puVar21 == (WeightParams *)0x0) {
        puVar21 = Specification::_WeightParams_default_instance_;
      }
      iVar2 = (((WeightParams *)puVar21)->floatvalue_).current_size_;
      lVar4 = *(long *)(((ulong)(((WeightParams *)puVar21)->float16value_).tagged_ptr_.ptr_ &
                        0xfffffffffffffffe) + 8);
      uVar20 = (0 < iVar2) + 1;
      if (lVar4 == 0) {
        uVar20 = (uint)(0 < iVar2);
      }
      lVar5 = *(long *)(((ulong)(((WeightParams *)puVar21)->rawvalue_).tagged_ptr_.ptr_ &
                        0xfffffffffffffffe) + 8);
      lVar6 = *(long *)(((ulong)(((WeightParams *)puVar21)->int8rawvalue_).tagged_ptr_.ptr_ &
                        0xfffffffffffffffe) + 8);
      uVar10 = (uint)(lVar6 == 0);
      uVar20 = (uVar20 - (lVar5 == 0)) + 2;
      cVar13 = '\x04';
      if (uVar20 - uVar10 < 2) {
        cVar13 = '\x05';
        if (uVar20 != uVar10) {
          cVar13 = iVar2 < 1;
        }
        if ((((lVar4 == 0) && (uVar20 != uVar10)) && (iVar2 < 1)) &&
           ((((lVar5 == 0 || (puVar21 == Specification::_WeightParams_default_instance_)) ||
             (cVar13 = '\x02', ((WeightParams *)puVar21)->quantization_ == (QuantizationParams *)0x0
             )) && (((lVar6 == 0 || (puVar21 == Specification::_WeightParams_default_instance_)) ||
                    (cVar13 = '\x03',
                    ((WeightParams *)puVar21)->quantization_ == (QuantizationParams *)0x0)))))) {
          cVar13 = '\x05';
        }
      }
      puVar18 = (undefined1 *)(local_58.batchnorm_)->mean_;
      if ((WeightParams *)puVar18 == (WeightParams *)0x0) {
        puVar18 = Specification::_WeightParams_default_instance_;
      }
      iVar2 = (((WeightParams *)puVar18)->floatvalue_).current_size_;
      lVar4 = *(long *)(((ulong)(((WeightParams *)puVar18)->float16value_).tagged_ptr_.ptr_ &
                        0xfffffffffffffffe) + 8);
      uVar20 = (0 < iVar2) + 1;
      if (lVar4 == 0) {
        uVar20 = (uint)(0 < iVar2);
      }
      lVar5 = *(long *)(((ulong)(((WeightParams *)puVar18)->rawvalue_).tagged_ptr_.ptr_ &
                        0xfffffffffffffffe) + 8);
      lVar6 = *(long *)(((ulong)(((WeightParams *)puVar18)->int8rawvalue_).tagged_ptr_.ptr_ &
                        0xfffffffffffffffe) + 8);
      uVar10 = (uint)(lVar6 == 0);
      uVar20 = (uVar20 - (lVar5 == 0)) + 2;
      cVar16 = '\x04';
      if (uVar20 - uVar10 < 2) {
        cVar16 = '\x05';
        if (uVar20 != uVar10) {
          cVar16 = iVar2 < 1;
        }
        if ((((lVar4 == 0) && (uVar20 != uVar10)) && (iVar2 < 1)) &&
           ((((lVar5 == 0 || (puVar18 == Specification::_WeightParams_default_instance_)) ||
             (cVar16 = '\x02', ((WeightParams *)puVar18)->quantization_ == (QuantizationParams *)0x0
             )) && (((lVar6 == 0 || (puVar18 == Specification::_WeightParams_default_instance_)) ||
                    (cVar16 = '\x03',
                    ((WeightParams *)puVar18)->quantization_ == (QuantizationParams *)0x0)))))) {
          cVar16 = '\x05';
        }
      }
      puVar18 = (undefined1 *)(local_58.batchnorm_)->variance_;
      if ((WeightParams *)puVar18 == (WeightParams *)0x0) {
        puVar18 = Specification::_WeightParams_default_instance_;
      }
      iVar2 = (((WeightParams *)puVar18)->floatvalue_).current_size_;
      lVar4 = *(long *)(((ulong)(((WeightParams *)puVar18)->float16value_).tagged_ptr_.ptr_ &
                        0xfffffffffffffffe) + 8);
      uVar20 = (0 < iVar2) + 1;
      if (lVar4 == 0) {
        uVar20 = (uint)(0 < iVar2);
      }
      lVar5 = *(long *)(((ulong)(((WeightParams *)puVar18)->rawvalue_).tagged_ptr_.ptr_ &
                        0xfffffffffffffffe) + 8);
      lVar6 = *(long *)(((ulong)(((WeightParams *)puVar18)->int8rawvalue_).tagged_ptr_.ptr_ &
                        0xfffffffffffffffe) + 8);
      uVar10 = (uint)(lVar6 == 0);
      uVar20 = (uVar20 - (lVar5 == 0)) + 2;
      cVar19 = '\x04';
      if (uVar20 - uVar10 < 2) {
        cVar19 = '\x05';
        if (uVar20 != uVar10) {
          cVar19 = iVar2 < 1;
        }
        if (((((lVar4 == 0) && (uVar20 != uVar10)) && (iVar2 < 1)) &&
            (((lVar5 == 0 || (puVar18 == Specification::_WeightParams_default_instance_)) ||
             (cVar19 = '\x02', ((WeightParams *)puVar18)->quantization_ == (QuantizationParams *)0x0
             )))) && (((lVar6 == 0 || (puVar18 == Specification::_WeightParams_default_instance_))
                      || (cVar19 = '\x03',
                         ((WeightParams *)puVar18)->quantization_ == (QuantizationParams *)0x0)))) {
          cVar19 = '\x05';
        }
      }
      if (((cVar13 == '\x04') || (cVar16 == '\x04')) ||
         (bVar12 = (local_58.pooling_)->globalpooling_, (cVar19 == '\x04' & bVar12) != 0)) {
        std::operator+(&local_80,"Simple recurrent layer \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_80);
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        psVar17 = (size_type *)(plVar15 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar15 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar17) {
          local_a0.field_2._M_allocated_capacity = *psVar17;
          local_a0.field_2._8_8_ = plVar15[3];
        }
        else {
          local_a0.field_2._M_allocated_capacity = *psVar17;
          local_a0._M_dataplus._M_p = (pointer)*plVar15;
        }
        local_a0._M_string_length = plVar15[1];
        *plVar15 = (long)psVar17;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_a0);
      }
      else {
        if (((cVar13 == '\x02') || (cVar16 == '\x02')) ||
           ((cVar13 == cVar16 && (((cVar19 == '\x02' || (cVar13 == cVar19)) || (bVar12 == false)))))
           ) {
          uVar7 = (local_58.simplerecurrent_)->outputvectorsize_;
          uVar8 = (local_58.batchnorm_)->channels_;
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          local_60 = paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"SimpleRNN","");
          pvVar9 = (layer->name_).tagged_ptr_.ptr_;
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"WeightMatrix","");
          validateGeneralWeightParams
                    (__return_storage_ptr__,(WeightParams *)puVar21,uVar8 * uVar7,uVar7,&local_a0,
                     (string *)((ulong)pvVar9 & 0xfffffffffffffffe),&local_80);
          LVar11 = local_58;
          paVar1 = local_60;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          bVar14 = Result::good(__return_storage_ptr__);
          if (!bVar14) {
            return __return_storage_ptr__;
          }
          plVar15 = (long *)(__return_storage_ptr__->m_message)._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar15 != paVar1) {
            operator_delete(plVar15,paVar1->_M_allocated_capacity + 1);
          }
          puVar21 = (undefined1 *)(LVar11.batchnorm_)->mean_;
          if ((WeightParams *)puVar21 == (WeightParams *)0x0) {
            puVar21 = Specification::_WeightParams_default_instance_;
          }
          uVar7 = (LVar11.simplerecurrent_)->outputvectorsize_;
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"SimpleRNN","");
          pvVar9 = (layer->name_).tagged_ptr_.ptr_;
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"RecursionMatrix","");
          validateGeneralWeightParams
                    (__return_storage_ptr__,(WeightParams *)puVar21,uVar7 * uVar7,uVar7,&local_a0,
                     (string *)((ulong)pvVar9 & 0xfffffffffffffffe),&local_80);
          LVar11 = local_58;
          paVar1 = local_60;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          bVar14 = Result::good(__return_storage_ptr__);
          if (!bVar14) {
            return __return_storage_ptr__;
          }
          plVar15 = (long *)(__return_storage_ptr__->m_message)._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar15 != paVar1) {
            operator_delete(plVar15,paVar1->_M_allocated_capacity + 1);
          }
          if (bVar12 != false) {
            puVar21 = (undefined1 *)(LVar11.batchnorm_)->variance_;
            if ((WeightParams *)puVar21 == (WeightParams *)0x0) {
              puVar21 = Specification::_WeightParams_default_instance_;
            }
            uVar7 = (LVar11.simplerecurrent_)->outputvectorsize_;
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"SimpleRNN","");
            pvVar9 = (layer->name_).tagged_ptr_.ptr_;
            local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"BiasVector","");
            validateGeneralWeightParams
                      (__return_storage_ptr__,(WeightParams *)puVar21,uVar7,1,&local_a0,
                       (string *)((ulong)pvVar9 & 0xfffffffffffffffe),&local_80);
            paVar1 = local_60;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
              operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
            }
            bVar12 = Result::good(__return_storage_ptr__);
            if (!bVar12) {
              return __return_storage_ptr__;
            }
            plVar15 = (long *)(__return_storage_ptr__->m_message)._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar15 != paVar1) {
              operator_delete(plVar15,paVar1->_M_allocated_capacity + 1);
            }
          }
          if (layer->_oneof_case_[0] == 400) {
            puVar21 = *(undefined1 **)&layer->layer_;
          }
          else {
            puVar21 = Specification::_SimpleRecurrentLayerParams_default_instance_;
          }
          puVar21 = (undefined1 *)(((ActivationParams *)puVar21)->NonlinearityType_).linear_;
          if ((ActivationParams *)puVar21 == (ActivationParams *)0x0) {
            puVar21 = Specification::_ActivationParams_default_instance_;
          }
          validateRecurrentActivationParams(__return_storage_ptr__,(ActivationParams *)puVar21);
          return __return_storage_ptr__;
        }
        std::operator+(&local_80,"Simple recurrent layer \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_80);
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        psVar17 = (size_type *)(plVar15 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar15 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar17) {
          local_a0.field_2._M_allocated_capacity = *psVar17;
          local_a0.field_2._8_8_ = plVar15[3];
        }
        else {
          local_a0.field_2._M_allocated_capacity = *psVar17;
          local_a0._M_dataplus._M_p = (pointer)*plVar15;
        }
        local_a0._M_string_length = plVar15[1];
        *plVar15 = (long)psVar17;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_a0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateSimpleRecurrentLayer(const Specification::NeuralNetworkLayer& layer) {
    // Must specify hidden state
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 2, 2));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 2, 2));

    if (ndArrayInterpretation) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "SimpleRecurrent", blobNameToRank));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "SimpleRecurrent", 5, 5, blobNameToRank));
    }

    const auto& params = layer.simplerecurrent();
    bool hasBiasVector = params.hasbiasvector();
    WeightParamType weightMatrixValueType, recursionMatrixValueType, biasVectorValueType;
    weightMatrixValueType = valueType(params.weightmatrix());
    recursionMatrixValueType = valueType(params.recursionmatrix());
    biasVectorValueType = valueType(params.biasvector());

    // Verify all weights are of valid type
    if((weightMatrixValueType == UNSPECIFIED) || recursionMatrixValueType == UNSPECIFIED || (hasBiasVector && biasVectorValueType == UNSPECIFIED)){
        std::string err = "Simple recurrent layer '" + layer.name() + "' has invalid weightMatrix/recusionMatrix/Bias fields.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    // Verify either weightMatrix, recursionMatrix, and biasVector are all FP32 or FP16, or one of them is quantized
    if (weightMatrixValueType != QUINT && recursionMatrixValueType != QUINT){
        if (weightMatrixValueType != recursionMatrixValueType ||
            (hasBiasVector && biasVectorValueType != QUINT && weightMatrixValueType != biasVectorValueType) ){
            std::string err = "Simple recurrent layer '" + layer.name() + "' has invalid weightMatrix/recusionMatrix/Bias fields. "
            "Field value types should match and should either be half or full precision.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }

    // Check weight matrix size
    // input matrix
    uint64_t input_matrix_size = params.inputvectorsize() * params.outputvectorsize();
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(params.weightmatrix(), input_matrix_size,
                                                                  params.outputvectorsize(),
                                                                  "SimpleRNN", layer.name(), "WeightMatrix"));

    // recurrent matrix
    uint64_t recurrent_matrix_size = params.outputvectorsize() * params.outputvectorsize();
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(params.recursionmatrix(), recurrent_matrix_size,
                                                                  params.outputvectorsize(), "SimpleRNN",
                                                                  layer.name(), "RecursionMatrix"));

    // bias
    if (hasBiasVector){
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(params.biasvector(), params.outputvectorsize(), 1,
                                                                      "SimpleRNN", layer.name(), "BiasVector"));
    }
    // Validate the activations as well
    return validateRecurrentActivationParams(layer.simplerecurrent().activation());

}